

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gedung.h
# Opt level: O3

void __thiscall KumpulanKubus::print(KumpulanKubus *this,FrameBuffer *fb)

{
  blok *pbVar1;
  long lVar2;
  long lVar3;
  
  pbVar1 = this->stei;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->fmipa;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->fsrd;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->fitb;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->fttm;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->sith;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->sf;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->sbm;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->umum;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->other;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->ftsl;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->sappk;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->ftmd;
  if (0 < (pbVar1->super_Shape).size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->fti;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar2 < (pbVar1->super_Shape).size);
  }
  return;
}

Assistant:

void print(FrameBuffer& fb){
    stei->print(fb);
    fmipa->print(fb);
    fsrd->print(fb);
    fitb->print(fb);
    fttm->print(fb);
    sith->print(fb);
    sf->print(fb);
    sbm->print(fb);
    umum->print(fb);
    other->print(fb);
    ftsl->print(fb);
    sappk->print(fb);
    ftmd->print(fb);
    fti->print(fb);
  }